

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O3

NodeRange __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
::
AddConstraintAndTryNoteResultVariable<mp::IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<0>>>>
          (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
           *this,IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>
                 *con)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  NodeRange NVar4;
  
  iVar2 = ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<0>>>>
          ::
          AddConstraint<mp::IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<0>>>>
                    ((ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<0>>>>
                      *)(this + 0x5f00),*(int *)(this + 0xb38),con);
  uVar3 = iVar2 >> 0x1f & *(uint *)(this + 0x5f58);
  iVar1 = uVar3 + iVar2;
  iVar2 = iVar2 + uVar3 + 1;
  if ((int)*(uint *)(this + 0x5f58) <= iVar1) {
    *(long *)(this + 0x5f58) = (long)iVar2;
  }
  NVar4.ir_.end_ = iVar2;
  NVar4.ir_.beg_ = iVar1;
  NVar4.pvn_ = (ValueNode *)(this + 0x5f08);
  return NVar4;
}

Assistant:

pre::NodeRange AddConstraintAndTryNoteResultVariable(Constraint&& con) {
    const auto resvar = con.GetResultVar();
    auto& ck = GET_CONSTRAINT_KEEPER( Constraint );
    auto i = ck.AddConstraint(constr_depth_, std::move(con));
    ConInfo ci{&ck, i};
    if (resvar>=0)
      AddInitExpression(resvar, ci);
    /// Can also cache non-functional constraints,
    /// but then implement checking before
    if (! MP_DISPATCH( MapInsert(
                         MPD(template GetConstraint<Constraint>(i)), i ) ))
      MP_RAISE("Trying to MapInsert() duplicated constraint: " +
                             ck.GetDescription());
    return ck.SelectValueNodeRange(i);
  }